

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O3

bool IsOnLeft(expr_node *node)

{
  if (node->parent != (expr_node *)0x0) {
    return node->parent->left == node;
  }
  return false;
}

Assistant:

bool IsOnLeft(const expr_node* node)
{
    if (node->parent == nullptr)
        return false;
    else if (node->parent->left == node)
        return true;
    else
        return false;
}